

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar5 = (int)CONCAT62(in_register_0000003a,op);
  uVar7 = iVar5 - 0x97;
  if (uVar7 < 0xf) {
    if ((0x78U >> (uVar7 & 0x1f) & 1) == 0) {
      if ((7U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x6000U >> (uVar7 & 0x1f) & 1) != 0) {
          Output::Print(L" R%d[R%d]",(ulong)data->Instance,(ulong)data->Element);
          return;
        }
        goto LAB_00754531;
      }
      goto LAB_00754565;
    }
  }
  else {
LAB_00754531:
    if ((0x3f < iVar5 - 0x117U) ||
       ((0xe000000000000019U >> ((ulong)(iVar5 - 0x117U) & 0x3f) & 1) == 0)) {
      if (iVar5 != 0x2b) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x20b,"(false)","Unknown OpCode for OpLayoutElementI");
        if (bVar6) {
          *puVar8 = 0;
          return;
        }
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
LAB_00754565:
      uVar1 = data->Value;
      uVar2 = data->Instance;
      uVar3 = data->Element;
      form = L" R%d = R%d[R%d]";
      goto LAB_00754577;
    }
  }
  uVar1 = data->Instance;
  uVar2 = data->Element;
  uVar3 = data->Value;
  form = L" R%d[R%d] = R%d";
LAB_00754577:
  Output::Print(form,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementI(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::ProfiledLdElemI_A:
            case OpCode::LdElemI_A:
            case OpCode::LdMethodElem:
            case OpCode::TypeofElem:
            {
                Output::Print(_u(" R%d = R%d[R%d]"), data->Value, data->Instance, data->Element);
                break;
            }
            case OpCode::ProfiledStElemI_A:
            case OpCode::ProfiledStElemI_A_Strict:
            case OpCode::StElemI_A:
            case OpCode::StElemI_A_Strict:
            case OpCode::InitSetElemI:
            case OpCode::InitGetElemI:
            case OpCode::InitComputedProperty:
            case OpCode::InitClassMemberComputedName:
            case OpCode::InitClassMemberGetComputedName:
            case OpCode::InitClassMemberSetComputedName:
            {
                Output::Print(_u(" R%d[R%d] = R%d"), data->Instance, data->Element, data->Value);
                break;
            }
            case OpCode::DeleteElemI_A:
            case OpCode::DeleteElemIStrict_A:
            {
                Output::Print(_u(" R%d[R%d]"), data->Instance, data->Element);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementI");
                break;
            }
        }
    }